

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinTrace
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  anon_union_8_3_4e909c26_for_v aVar2;
  undefined4 uVar3;
  ostream *poVar4;
  RuntimeError *__return_storage_ptr__;
  Type t;
  string str;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1->t == STRING) {
    encode_utf8((string *)local_1b0,(UString *)((pVVar1->v).h + 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TRACE: ",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(loc->file)._M_dataplus._M_p,
                        (loc->file)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_1b0._0_8_,local_1b0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pVVar1 = (args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar3 = *(undefined4 *)&pVVar1[1].field_0x4;
    aVar2 = pVVar1[1].v;
    (this->scratch).t = pVVar1[1].t;
    *(undefined4 *)&(this->scratch).field_0x4 = uVar3;
    (this->scratch).v = aVar2;
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    return (AST *)0x0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  poVar4 = (ostream *)(local_1b0 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Builtin function trace expected string as first parameter but ",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"got ",4);
  (anonymous_namespace)::type_str_abi_cxx11_
            (&local_1d0,
             (_anonymous_namespace_ *)
             (ulong)((args->
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                     )._M_impl.super__Vector_impl_data._M_start)->t,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(__return_storage_ptr__,&this->stack,loc,&local_1d0);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinTrace(const LocationRange &loc, const std::vector<Value> &args)
    {
        if(args[0].t != Value::STRING) {
            std::stringstream ss;
            ss << "Builtin function trace expected string as first parameter but "
               << "got " << type_str(args[0].t);
            throw makeError(loc, ss.str());
        }

        std::string str = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);
        std::cerr << "TRACE: " << loc.file << ":" << loc.begin.line << " " <<  str
            << std::endl;

        scratch = args[1];
        return nullptr;
    }